

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

PackedData * __thiscall
soul::Value::PackedData::StructIterator::get
          (PackedData *__return_storage_ptr__,StructIterator *this)

{
  Member *t;
  
  t = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                (&this->structure->members,this->index - 1);
  PackedData(__return_storage_ptr__,&t->type,this->member,this->memberSize);
  return __return_storage_ptr__;
}

Assistant:

PackedData get() const      { return PackedData (structure.getMemberType (index - 1), member, memberSize); }